

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

char * aux_upvalue(StkId fi,int n,TValue **val,CClosure **owner,UpVal **uv,ravi_type_map *type,
                  TString **usertype)

{
  ushort uVar1;
  CClosure *pCVar2;
  lua_CFunction p_Var3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  char *pcVar7;
  
  *type = 0xffffffff;
  *usertype = (TString *)0x0;
  uVar1 = fi->tt_;
  if ((uVar1 & 0x7f) == 6) {
    if (uVar1 == 0x8006) {
      p_Var3 = (fi->value_).f;
      if (p_Var3[8] == (_func_int_lua_State_ptr)0x6) {
        if (n < 1) {
          return (char *)0x0;
        }
        lVar4 = *(long *)(p_Var3 + 0x18);
        if (*(int *)(lVar4 + 0x10) < n) {
          return (char *)0x0;
        }
        uVar6 = (ulong)(n - 1);
        *val = (TValue *)**(undefined8 **)(p_Var3 + uVar6 * 8 + 0x20);
        if (uv != (UpVal **)0x0) {
          *uv = *(UpVal **)(p_Var3 + uVar6 * 8 + 0x20);
        }
        lVar4 = *(long *)(lVar4 + 0x58);
        lVar5 = *(long *)(lVar4 + uVar6 * 0x18);
        *type = *(ravi_type_map *)(lVar4 + 0x10 + uVar6 * 0x18);
        *usertype = *(TString **)(lVar4 + 8 + uVar6 * 0x18);
        if (lVar5 != 0) {
          return (char *)(lVar5 + 0x18);
        }
        return "(*no name)";
      }
      pcVar7 = "(((fi)->value_).gc)->tt == ((6) | ((0) << 4))";
    }
    else {
      pcVar7 = "((((fi))->tt_) == (((((6) | ((0) << 4))) | (1 << 15))))";
    }
    __assert_fail(pcVar7,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x631,
                  "const char *aux_upvalue(StkId, int, TValue **, CClosure **, UpVal **, ravi_type_map *, TString **)"
                 );
  }
  if ((uVar1 & 0x7f) != 0x26) {
    return (char *)0x0;
  }
  if (uVar1 == 0x8026) {
    pCVar2 = (CClosure *)(fi->value_).f;
    if (pCVar2->tt == '&') {
      if (n < 1) {
        return (char *)0x0;
      }
      if ((uint)pCVar2->nupvalues < (uint)n) {
        return (char *)0x0;
      }
      *val = pCVar2->upvalue + (n - 1);
      if (owner != (CClosure **)0x0) {
        *owner = pCVar2;
        return "";
      }
      return "";
    }
    pcVar7 = "(((fi)->value_).gc)->tt == ((6) | ((2) << 4))";
  }
  else {
    pcVar7 = "((((fi))->tt_) == (((((6) | ((2) << 4))) | (1 << 15))))";
  }
  __assert_fail(pcVar7,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,0x62a,
                "const char *aux_upvalue(StkId, int, TValue **, CClosure **, UpVal **, ravi_type_map *, TString **)"
               );
}

Assistant:

static const char *aux_upvalue (StkId fi, int n, TValue **val,
                                CClosure **owner, UpVal **uv, ravi_type_map *type, TString **usertype) {
  *type = RAVI_TM_ANY;
  *usertype = NULL;
  switch (ttype(fi)) {
    case LUA_TCCL: {  /* C closure */
      CClosure *f = clCvalue(fi);
      if (!(1 <= n && n <= f->nupvalues)) return NULL;
      *val = &f->upvalue[n-1];
      if (owner) *owner = f;
      return "";
    }
    case LUA_TLCL: {  /* Lua closure */
      LClosure *f = clLvalue(fi);
      TString *name;
      Proto *p = f->p;
      if (!(1 <= n && n <= p->sizeupvalues)) return NULL;
      *val = f->upvals[n-1]->v;
      if (uv) *uv = f->upvals[n - 1];
      name = p->upvalues[n-1].name;
      *type = p->upvalues[n - 1].ravi_type_map;
      *usertype = p->upvalues[n - 1].usertype;
      return (name == NULL) ? "(*no name)" : getstr(name);
    }
    default: return NULL;  /* not a closure */
  }
}